

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vgmplayer.cpp
# Opt level: O1

UINT32 __thiscall VGMPlayer::GetHeaderChipClock(VGMPlayer *this,UINT8 chipType)

{
  if (0x29 < chipType) {
    return 0;
  }
  if (this->_v101Fix != '\0') {
    if (chipType == '\x03') {
      return this->_v101ym2151clock;
    }
    if (chipType == '\x02') {
      return this->_v101ym2612clock;
    }
    if (chipType == '\x01') {
      return this->_v101ym2413clock;
    }
  }
  return *(UINT32 *)(this->_hdrBuffer + _CHIPCLK_OFS[chipType]);
}

Assistant:

UINT32 VGMPlayer::GetHeaderChipClock(UINT8 chipType) const
{
	if (chipType >= _CHIP_COUNT)
		return 0;

	// Fix for 1.00/1.01 "FM" clock
	if (_v101Fix)
	{
		switch (chipType)
		{
		case 1:
			return _v101ym2413clock;
		case 2:
			return _v101ym2612clock;
		case 3:
			return _v101ym2151clock;
		default:
			break;
		}
	}
	
	return ReadLE32(&_hdrBuffer[_CHIPCLK_OFS[chipType]]);
}